

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createExpressions.cpp
# Opt level: O0

string * getAsmUsedRegString_abi_cxx11_(ConstraintInfoVector *info)

{
  bool bVar1;
  int iVar2;
  pointer pCVar3;
  reference pvVar4;
  string *in_RDI;
  string clobber;
  iterator iter;
  bool first;
  string *ret;
  string *in_stack_fffffffffffffa38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffa50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  char *in_stack_fffffffffffffa60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa70;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa78;
  string *local_568;
  string local_3c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_390;
  string local_388 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  ConstraintInfo *local_348;
  __normal_iterator<llvm::InlineAsm::ConstraintInfo_*,_std::vector<llvm::InlineAsm::ConstraintInfo,_std::allocator<llvm::InlineAsm::ConstraintInfo>_>_>
  local_340;
  byte local_336;
  undefined1 local_335;
  undefined1 local_333;
  allocator local_332;
  allocator local_331;
  allocator local_330;
  allocator local_32f;
  allocator local_32e;
  allocator local_32d;
  allocator local_32c;
  allocator local_32b;
  allocator local_32a;
  allocator local_329;
  allocator local_328;
  allocator local_327;
  allocator local_326;
  allocator local_325;
  allocator local_324;
  allocator local_323;
  allocator local_322;
  allocator local_321;
  allocator local_320;
  allocator local_31f;
  allocator local_31e;
  allocator local_31d [20];
  allocator local_309;
  string *local_308;
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  string *local_20;
  undefined8 local_18;
  
  if ((getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
       ::CLOBBER_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                                   ::CLOBBER_abi_cxx11_), iVar2 != 0)) {
    local_333 = 1;
    local_308 = local_300;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_300,"memory",&local_309);
    local_308 = local_2e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e0,"rax",local_31d);
    local_308 = local_2c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"eax",&local_31e);
    local_308 = local_2a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"ax",&local_31f);
    local_308 = local_280;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_280,"al",&local_320);
    local_308 = local_260;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,"rbx",&local_321);
    local_308 = local_240;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"ebx",&local_322);
    local_308 = local_220;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"bx",&local_323);
    local_308 = local_200;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,"bl",&local_324);
    local_308 = local_1e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e0,"rcx",&local_325);
    local_308 = local_1c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,"ecx",&local_326);
    local_308 = local_1a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"cx",&local_327);
    local_308 = local_180;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"cl",&local_328);
    local_308 = local_160;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"rdx",&local_329);
    local_308 = local_140;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"edx",&local_32a);
    local_308 = local_120;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"dx",&local_32b);
    local_308 = local_100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"dl",&local_32c);
    local_308 = local_e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"rsi",&local_32d);
    local_308 = local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"esi",&local_32e);
    local_308 = local_a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"si",&local_32f);
    local_308 = local_80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"rdi",&local_330);
    local_308 = local_60;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"edi",&local_331);
    local_308 = local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"di",&local_332);
    local_333 = 0;
    local_20 = local_300;
    local_18 = 0x17;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x26dc33);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffffa70,in_stack_fffffffffffffa78,
             (allocator_type *)in_stack_fffffffffffffa68);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x26dc63);
    local_568 = (string *)&local_20;
    do {
      local_568 = local_568 + -0x20;
      std::__cxx11::string::~string(local_568);
    } while (local_568 != local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_332);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    std::allocator<char>::~allocator((allocator<char> *)&local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_32f);
    std::allocator<char>::~allocator((allocator<char> *)&local_32e);
    std::allocator<char>::~allocator((allocator<char> *)&local_32d);
    std::allocator<char>::~allocator((allocator<char> *)&local_32c);
    std::allocator<char>::~allocator((allocator<char> *)&local_32b);
    std::allocator<char>::~allocator((allocator<char> *)&local_32a);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    std::allocator<char>::~allocator((allocator<char> *)&local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_327);
    std::allocator<char>::~allocator((allocator<char> *)&local_326);
    std::allocator<char>::~allocator((allocator<char> *)&local_325);
    std::allocator<char>::~allocator((allocator<char> *)&local_324);
    std::allocator<char>::~allocator((allocator<char> *)&local_323);
    std::allocator<char>::~allocator((allocator<char> *)&local_322);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
    std::allocator<char>::~allocator((allocator<char> *)&local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_31f);
    std::allocator<char>::~allocator((allocator<char> *)&local_31e);
    std::allocator<char>::~allocator((allocator<char> *)local_31d);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,
                 &getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                  ::CLOBBER_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                         ::CLOBBER_abi_cxx11_);
  }
  local_335 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  local_336 = 1;
  local_340._M_current =
       (ConstraintInfo *)
       std::
       vector<llvm::InlineAsm::ConstraintInfo,_std::allocator<llvm::InlineAsm::ConstraintInfo>_>::
       begin((vector<llvm::InlineAsm::ConstraintInfo,_std::allocator<llvm::InlineAsm::ConstraintInfo>_>
              *)in_stack_fffffffffffffa38);
  while( true ) {
    local_348 = (ConstraintInfo *)
                std::
                vector<llvm::InlineAsm::ConstraintInfo,_std::allocator<llvm::InlineAsm::ConstraintInfo>_>
                ::end((vector<llvm::InlineAsm::ConstraintInfo,_std::allocator<llvm::InlineAsm::ConstraintInfo>_>
                       *)in_stack_fffffffffffffa38);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<llvm::InlineAsm::ConstraintInfo_*,_std::vector<llvm::InlineAsm::ConstraintInfo,_std::allocator<llvm::InlineAsm::ConstraintInfo>_>_>
                        *)in_stack_fffffffffffffa40,
                       (__normal_iterator<llvm::InlineAsm::ConstraintInfo_*,_std::vector<llvm::InlineAsm::ConstraintInfo,_std::allocator<llvm::InlineAsm::ConstraintInfo>_>_>
                        *)in_stack_fffffffffffffa38);
    if (!bVar1) break;
    pCVar3 = __gnu_cxx::
             __normal_iterator<llvm::InlineAsm::ConstraintInfo_*,_std::vector<llvm::InlineAsm::ConstraintInfo,_std::allocator<llvm::InlineAsm::ConstraintInfo>_>_>
             ::operator->(&local_340);
    if (pCVar3->Type == isClobber) {
      pCVar3 = __gnu_cxx::
               __normal_iterator<llvm::InlineAsm::ConstraintInfo_*,_std::vector<llvm::InlineAsm::ConstraintInfo,_std::allocator<llvm::InlineAsm::ConstraintInfo>_>_>
               ::operator->(&local_340);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&pCVar3->Codes,0);
      std::__cxx11::string::string((string *)&local_368,(string *)pvVar4);
      __first._M_current = &local_368;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_388,(ulong)__first._M_current);
      in_stack_fffffffffffffa48 = &local_368;
      in_stack_fffffffffffffa38 = local_388;
      std::__cxx11::string::operator=((string *)in_stack_fffffffffffffa48,in_stack_fffffffffffffa38)
      ;
      std::__cxx11::string::~string(in_stack_fffffffffffffa38);
      in_stack_fffffffffffffa40 =
           &getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
            ::CLOBBER_abi_cxx11_;
      local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffa38);
      local_3a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa38);
      in_stack_fffffffffffffa50 =
           std::
           find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                     (__first,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
      local_390 = in_stack_fffffffffffffa50._M_current;
      local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa38);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffa40,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffa38);
      if (bVar1) {
        if ((local_336 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)in_RDI,", ");
        }
        local_336 = 0;
        std::__cxx11::string::operator+=((string *)in_RDI,"\"");
        iVar2 = std::__cxx11::string::compare((char *)&local_368);
        if (iVar2 != 0) {
          std::__cxx11::string::operator+=((string *)in_RDI,"%");
        }
        std::operator+(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
        std::__cxx11::string::operator+=((string *)in_RDI,local_3c8);
        std::__cxx11::string::~string(local_3c8);
      }
      std::__cxx11::string::~string((string *)&local_368);
    }
    __gnu_cxx::
    __normal_iterator<llvm::InlineAsm::ConstraintInfo_*,_std::vector<llvm::InlineAsm::ConstraintInfo,_std::allocator<llvm::InlineAsm::ConstraintInfo>_>_>
    ::operator++((__normal_iterator<llvm::InlineAsm::ConstraintInfo_*,_std::vector<llvm::InlineAsm::ConstraintInfo,_std::allocator<llvm::InlineAsm::ConstraintInfo>_>_>
                  *)in_stack_fffffffffffffa48,(int)((ulong)in_stack_fffffffffffffa40 >> 0x20));
  }
  return in_RDI;
}

Assistant:

std::string getAsmUsedRegString(llvm::InlineAsm::ConstraintInfoVector info) {
    static std::vector<std::string> CLOBBER = {"memory", "rax", "eax", "ax", "al", "rbx", "ebx", "bx", "bl", "rcx", "ecx", "cx",
                                               "cl", "rdx", "edx", "dx", "dl", "rsi", "esi", "si", "rdi", "edi", "di"};

    std::string ret;
    bool first = true;

    for (llvm::InlineAsm::ConstraintInfoVector::iterator iter = info.begin(); iter != info.end(); iter++) {
        if (iter->Type != llvm::InlineAsm::isClobber) {
            continue;
        }

        std::string clobber = iter->Codes[0];
        clobber = clobber.substr(1, clobber.size() - 2);

        if (std::find(CLOBBER.begin(), CLOBBER.end(), clobber) != CLOBBER.end()) {
            if (!first) {
                ret += ", ";
            }
            first = false;

            ret += "\"";
            if (clobber.compare("memory") != 0) {
                ret += "%";
            }
            ret += clobber + "\"";
        }
    }

    return ret;
}